

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_194fe6::BuildFileImpl::parseCommandsMapping(BuildFileImpl *this,MappingNode *map)

{
  BuildFileDelegate *pBVar1;
  pointer ppNVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  KeyValueNode *pKVar6;
  Node *pNVar7;
  ScalarNode *pSVar8;
  MappingNode *this_00;
  undefined8 uVar9;
  size_type sVar10;
  Tool *pTVar11;
  SequenceNode *this_01;
  Node *pNVar12;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> *this_02
  ;
  ScalarNode *pSVar13;
  pointer pCVar14;
  iterator __first;
  iterator __last;
  undefined8 uVar15;
  type pCVar16;
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  *this_03;
  StringRef local_930;
  string local_910;
  undefined8 local_8f0;
  undefined8 local_8e0;
  undefined8 local_8d8;
  ConfigureContext local_8d0;
  StringRef local_8a8;
  allocator<llvm::StringRef> local_891;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_890;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_888;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_880;
  ArrayRef<llvm::StringRef> local_868;
  undefined8 local_858;
  undefined8 local_850;
  ConfigureContext local_848;
  string local_820;
  StringRef local_800;
  ScalarNode *local_7f0;
  Node *node_1;
  iterator __end9;
  iterator __begin9;
  SequenceNode *__range9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_1;
  vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
  local_7a0;
  undefined8 local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined8 local_770;
  ConfigureContext local_768;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_740;
  undefined1 local_700 [8];
  string value_1;
  string key_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  StringRef local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  StringRef local_630;
  KeyValueNode *local_620;
  KeyValueNode *entry_1;
  iterator __end8;
  iterator __begin8;
  MappingNode *__range8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  string attribute;
  string local_5b8;
  undefined8 local_598;
  ConfigureContext local_588;
  StringRef local_560;
  StringRef local_550;
  ConfigureContext local_540;
  pointer local_518;
  string local_510;
  StringRef local_4f0;
  Node *local_4e0;
  Node *node;
  ScalarNode *local_4c8;
  Node *nodeName_1;
  iterator __end6;
  iterator __begin6;
  SequenceNode *__range6;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> nodes_1;
  SequenceNode *nodeNames_1;
  StringRef local_478;
  ConfigureContext local_468;
  string local_440;
  StringRef local_420;
  Node *local_410;
  StringRef local_408;
  ScalarNode *local_3f8;
  Node *nodeName;
  iterator __end5;
  iterator __begin5;
  SequenceNode *__range5;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> nodes;
  SequenceNode *nodeNames;
  StringRef local_3a8;
  Node *value;
  Node *key;
  StringRef local_380;
  undefined8 local_370;
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  local_360;
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  command;
  StringRef local_338;
  Tool *tool;
  StringRef local_318;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_308;
  StringRef local_300;
  StringRef local_2f0;
  StringRef local_2e0;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_2d0;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_2c8;
  iterator it;
  StringRef local_2b8;
  StringRef local_2a8;
  MappingNode *attrs;
  string name;
  StringRef local_260;
  KeyValueNode *entry;
  iterator __end2;
  iterator __begin2;
  MappingNode *__range2;
  MappingNode *map_local;
  BuildFileImpl *this_local;
  
  __end2 = llvm::yaml::MappingNode::begin(map);
  entry = (KeyValueNode *)llvm::yaml::MappingNode::end(map);
  while (bVar3 = llvm::yaml::
                 basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                 operator!=(&__end2,(basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                     *)&entry), bVar3) {
    pKVar6 = llvm::yaml::
             basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator*
                       (&__end2);
    pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar6);
    uVar4 = llvm::yaml::Node::getType(pNVar7);
    if (uVar4 == 1) {
      pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar6);
      uVar4 = llvm::yaml::Node::getType(pNVar7);
      if (uVar4 == 4) {
        pSVar8 = (ScalarNode *)llvm::yaml::KeyValueNode::getKey(pKVar6);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  ((string *)&attrs,this,pSVar8);
        this_00 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar6);
        uVar9 = std::__cxx11::string::data();
        local_2a8.Data = (char *)uVar9;
        uVar9 = std::__cxx11::string::length();
        local_2a8.Length = uVar9;
        sVar10 = llvm::
                 StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                 ::count(&this->commands,local_2a8);
        if (sVar10 == 0) {
          local_2c8.Base = (MappingNode *)llvm::yaml::MappingNode::begin(this_00);
          local_2d0.Base = (MappingNode *)llvm::yaml::MappingNode::end(this_00);
          bVar3 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator==(&local_2c8,&local_2d0);
          if (bVar3) {
            pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar6);
            strlen("missing \'tool\' key for command in \'command\' map");
            error(this,pNVar7,local_2e0);
            it.Base._4_4_ = 3;
          }
          else {
            pKVar6 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_2c8);
            pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar6);
            strlen("tool");
            bVar3 = nodeIsScalarString(this,pNVar7,local_2f0);
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              pKVar6 = llvm::yaml::
                       basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                       ::operator->(&local_2c8);
              pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar6);
              uVar4 = llvm::yaml::Node::getType(pNVar7);
              if (uVar4 == 1) {
                pKVar6 = llvm::yaml::
                         basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                         ::operator->(&local_2c8);
                pSVar8 = (ScalarNode *)llvm::yaml::KeyValueNode::getValue(pKVar6);
                (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                          ((string *)&command,this,pSVar8);
                uVar9 = std::__cxx11::string::data();
                local_338.Data = (char *)uVar9;
                uVar9 = std::__cxx11::string::length();
                local_338.Length = uVar9;
                pKVar6 = llvm::yaml::
                         basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                         ::operator->(&local_2c8);
                pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar6);
                pTVar11 = getOrCreateTool(this,local_338,pNVar7);
                std::__cxx11::string::~string((string *)&command);
                if (pTVar11 == (Tool *)0x0) {
                  this_local._7_1_ = 0;
                  it.Base._4_4_ = 1;
                }
                else {
                  local_370 = std::__cxx11::string::data();
                  uVar9 = std::__cxx11::string::length();
                  (*pTVar11->_vptr_Tool[5])(&local_360,pTVar11,local_370,uVar9);
                  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_360);
                  if (bVar3) {
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                    operator++(&local_2c8);
                    while( true ) {
                      key = (Node *)llvm::yaml::MappingNode::end(this_00);
                      bVar3 = llvm::yaml::
                              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                              ::operator!=(&local_2c8,
                                           (basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                            *)&key);
                      if (!bVar3) break;
                      pKVar6 = llvm::yaml::
                               basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                               ::operator->(&local_2c8);
                      pSVar8 = (ScalarNode *)llvm::yaml::KeyValueNode::getKey(pKVar6);
                      pKVar6 = llvm::yaml::
                               basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                               ::operator->(&local_2c8);
                      this_01 = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(pKVar6);
                      strlen("inputs");
                      bVar3 = nodeIsScalarString(this,(Node *)pSVar8,local_3a8);
                      if (bVar3) {
                        uVar4 = llvm::yaml::Node::getType((Node *)this_01);
                        if (uVar4 == 5) {
                          nodes.
                          super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_01;
                          std::
                          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                          ::vector((vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                    *)&__range5);
                          ppNVar2 = nodes.
                                    super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          __end5 = llvm::yaml::SequenceNode::begin
                                             ((SequenceNode *)
                                              nodes.
                                              super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          nodeName = (Node *)llvm::yaml::SequenceNode::end((SequenceNode *)ppNVar2);
                          while (bVar3 = llvm::yaml::
                                         basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                         ::operator!=(&__end5,(
                                                  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                  *)&nodeName), bVar3) {
                            local_3f8 = (ScalarNode *)
                                        llvm::yaml::
                                        basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                        ::operator*(&__end5);
                            uVar4 = llvm::yaml::Node::getType((Node *)local_3f8);
                            pSVar13 = local_3f8;
                            if (uVar4 == 1) {
                              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                        (&local_440,this,local_3f8);
                              uVar9 = std::__cxx11::string::data();
                              local_420.Data = (char *)uVar9;
                              uVar9 = std::__cxx11::string::length();
                              local_420.Length = uVar9;
                              local_410 = getOrCreateNode(this,local_420,true);
                              std::
                              vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                              ::push_back((vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                           *)&__range5,&local_410);
                              std::__cxx11::string::~string((string *)&local_440);
                            }
                            else {
                              strlen("invalid node type in \'inputs\' command key");
                              error(this,&pSVar13->super_Node,local_408);
                            }
                            llvm::yaml::
                            basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                            operator++(&__end5);
                          }
                          pCVar14 = std::
                                    unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                    ::operator->(&local_360);
                          getContext(&local_468,this,(Node *)pSVar8);
                          (*(pCVar14->super_JobDescriptor)._vptr_JobDescriptor[8])
                                    (pCVar14,&local_468,&__range5);
                          std::
                          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                          ::~vector((vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                     *)&__range5);
                        }
                        else {
                          strlen("invalid value type for \'inputs\' command key");
                          error(this,(Node *)this_01,_nodeNames);
                        }
                      }
                      else {
                        strlen("outputs");
                        bVar3 = nodeIsScalarString(this,(Node *)pSVar8,local_478);
                        if (bVar3) {
                          uVar4 = llvm::yaml::Node::getType((Node *)this_01);
                          if (uVar4 == 5) {
                            nodes_1.
                            super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_01;
                            std::
                            vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                            ::vector((vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                      *)&__range6);
                            ppNVar2 = nodes_1.
                                      super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                            __end6 = llvm::yaml::SequenceNode::begin
                                               ((SequenceNode *)
                                                nodes_1.
                                                super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            nodeName_1 = (Node *)llvm::yaml::SequenceNode::end
                                                           ((SequenceNode *)ppNVar2);
                            while (bVar3 = llvm::yaml::
                                           basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                           ::operator!=(&__end6,(
                                                  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                  *)&nodeName_1), bVar3) {
                              local_4c8 = (ScalarNode *)
                                          llvm::yaml::
                                          basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                          ::operator*(&__end6);
                              uVar4 = llvm::yaml::Node::getType((Node *)local_4c8);
                              pSVar13 = local_4c8;
                              if (uVar4 == 1) {
                                (anonymous_namespace)::BuildFileImpl::
                                stringFromScalarNode_abi_cxx11_(&local_510,this,local_4c8);
                                uVar9 = std::__cxx11::string::data();
                                local_4f0.Data = (char *)uVar9;
                                uVar9 = std::__cxx11::string::length();
                                local_4f0.Length = uVar9;
                                pNVar12 = getOrCreateNode(this,local_4f0,true);
                                std::__cxx11::string::~string((string *)&local_510);
                                local_4e0 = pNVar12;
                                std::
                                vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                ::push_back((vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                             *)&__range6,&local_4e0);
                                this_02 = llbuild::buildsystem::Node::getProducers(local_4e0);
                                local_518 = std::
                                            unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                            ::get(&local_360);
                                std::
                                vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                                ::push_back(this_02,&local_518);
                              }
                              else {
                                strlen("invalid node type in \'outputs\' command key");
                                error(this,&pSVar13->super_Node,_node);
                              }
                              llvm::yaml::
                              basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                              ::operator++(&__end6);
                            }
                            pCVar14 = std::
                                      unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                      ::operator->(&local_360);
                            getContext(&local_540,this,(Node *)pSVar8);
                            (*(pCVar14->super_JobDescriptor)._vptr_JobDescriptor[9])
                                      (pCVar14,&local_540,&__range6);
                            std::
                            vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                            ::~vector((vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                                       *)&__range6);
                          }
                          else {
                            strlen("invalid value type for \'outputs\' command key");
                            error(this,(Node *)this_01,_nodeNames_1);
                          }
                        }
                        else {
                          strlen("description");
                          bVar3 = nodeIsScalarString(this,(Node *)pSVar8,local_550);
                          if (bVar3) {
                            uVar4 = llvm::yaml::Node::getType((Node *)this_01);
                            if (uVar4 == 1) {
                              pCVar14 = std::
                                        unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                        ::operator->(&local_360);
                              getContext(&local_588,this,(Node *)pSVar8);
                              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                        (&local_5b8,this,(ScalarNode *)this_01);
                              local_598 = std::__cxx11::string::data();
                              uVar9 = std::__cxx11::string::length();
                              (*(pCVar14->super_JobDescriptor)._vptr_JobDescriptor[7])
                                        (pCVar14,&local_588,local_598,uVar9);
                              std::__cxx11::string::~string((string *)&local_5b8);
                            }
                            else {
                              strlen("invalid value type for \'description\' command key");
                              error(this,(Node *)this_01,local_560);
                            }
                          }
                          else {
                            uVar4 = llvm::yaml::Node::getType((Node *)pSVar8);
                            if (uVar4 == 1) {
                              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                        ((string *)
                                         &values.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
                                         pSVar8);
                              uVar4 = llvm::yaml::Node::getType((Node *)this_01);
                              if (uVar4 == 4) {
                                std::
                                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&__range8);
                                __end8 = llvm::yaml::MappingNode::begin((MappingNode *)this_01);
                                entry_1 = (KeyValueNode *)
                                          llvm::yaml::MappingNode::end((MappingNode *)this_01);
                                while (bVar3 = llvm::yaml::
                                               basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                               ::operator!=(&__end8,(
                                                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                                  *)&entry_1), bVar3) {
                                  local_620 = llvm::yaml::
                                              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                              ::operator*(&__end8);
                                  pNVar7 = llvm::yaml::KeyValueNode::getKey(local_620);
                                  uVar4 = llvm::yaml::Node::getType(pNVar7);
                                  if (uVar4 == 1) {
                                    pNVar7 = llvm::yaml::KeyValueNode::getValue(local_620);
                                    uVar4 = llvm::yaml::Node::getType(pNVar7);
                                    if (uVar4 == 1) {
                                      pSVar13 = (ScalarNode *)
                                                llvm::yaml::KeyValueNode::getKey(local_620);
                                      (anonymous_namespace)::BuildFileImpl::
                                      stringFromScalarNode_abi_cxx11_
                                                ((string *)((long)&value_1.field_2 + 8),this,pSVar13
                                                );
                                      pSVar13 = (ScalarNode *)
                                                llvm::yaml::KeyValueNode::getValue(local_620);
                                      (anonymous_namespace)::BuildFileImpl::
                                      stringFromScalarNode_abi_cxx11_
                                                ((string *)local_700,this,pSVar13);
                                      std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                                                (&local_740,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&value_1.field_2 + 8),
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_700);
                                      std::
                                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::push_back((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&__range8,&local_740);
                                      std::
                                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~pair(&local_740);
                                      std::__cxx11::string::~string((string *)local_700);
                                      std::__cxx11::string::~string
                                                ((string *)(value_1.field_2._M_local_buf + 8));
                                    }
                                    else {
                                      pNVar7 = llvm::yaml::KeyValueNode::getKey(local_620);
                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&key_1.field_2 + 8),
                                                  "invalid value type for \'",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&values.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                      std::operator+(&local_6a0,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&key_1.field_2 + 8),
                                                  "\' in \'commands\' map");
                                      uVar9 = std::__cxx11::string::data();
                                      local_680.Data = (char *)uVar9;
                                      uVar9 = std::__cxx11::string::length();
                                      local_680.Length = uVar9;
                                      error(this,pNVar7,local_680);
                                      std::__cxx11::string::~string((string *)&local_6a0);
                                      std::__cxx11::string::~string
                                                ((string *)(key_1.field_2._M_local_buf + 8));
                                    }
                                  }
                                  else {
                                    pNVar7 = llvm::yaml::KeyValueNode::getKey(local_620);
                                    std::operator+(&local_670,"invalid key type for \'",
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&values.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                    std::operator+(&local_650,&local_670,"\' in \'commands\' map");
                                    uVar9 = std::__cxx11::string::data();
                                    local_630.Data = (char *)uVar9;
                                    uVar9 = std::__cxx11::string::length();
                                    local_630.Length = uVar9;
                                    error(this,pNVar7,local_630);
                                    std::__cxx11::string::~string((string *)&local_650);
                                    std::__cxx11::string::~string((string *)&local_670);
                                  }
                                  llvm::yaml::
                                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                  ::operator++(&__end8);
                                }
                                pCVar14 = std::
                                          unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                          ::operator->(&local_360);
                                getContext(&local_768,this,(Node *)pSVar8);
                                local_778 = std::__cxx11::string::data();
                                local_770 = std::__cxx11::string::length();
                                __first = std::
                                          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ::begin((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&__range8);
                                __last = std::
                                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)&__range8);
                                std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>::
                                allocator((allocator<std::pair<llvm::StringRef,_llvm::StringRef>_> *
                                          )((long)&values_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 7));
                                std::
                                vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                                ::
                                vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,void>
                                          ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                                            *)&local_7a0,
                                           (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            )__first._M_current,
                                           (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            )__last._M_current,
                                           (allocator_type *)
                                           ((long)&values_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 7));
                                llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>::
                                ArrayRef<std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                                          ((ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>> *)
                                           &local_788,&local_7a0);
                                iVar5 = (*(pCVar14->super_JobDescriptor)._vptr_JobDescriptor[0xc])
                                                  (pCVar14,&local_768,local_778,local_770,local_788,
                                                   local_780);
                                std::
                                vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                                ::~vector(&local_7a0);
                                std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>::
                                ~allocator((allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>
                                            *)((long)&values_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 7));
                                it.Base._4_1_ = (((byte)iVar5 ^ 0xff) & 1) != 0;
                                if (it.Base._4_1_) {
                                  this_local._7_1_ = 0;
                                }
                                it.Base._5_3_ = 0;
                                std::
                                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&__range8);
joined_r0x001eee45:
                                if (it.Base._4_4_ == 0) {
LAB_001ef06e:
                                  it.Base._4_4_ = 0;
                                }
                              }
                              else {
                                uVar4 = llvm::yaml::Node::getType((Node *)this_01);
                                if (uVar4 == 5) {
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&__range9);
                                  __end9 = llvm::yaml::SequenceNode::begin(this_01);
                                  node_1 = (Node *)llvm::yaml::SequenceNode::end(this_01);
                                  while (bVar3 = llvm::yaml::
                                                 basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                 ::operator!=(&__end9,(
                                                  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                  *)&node_1), bVar3) {
                                    local_7f0 = (ScalarNode *)
                                                llvm::yaml::
                                                basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                ::operator*(&__end9);
                                    uVar4 = llvm::yaml::Node::getType((Node *)local_7f0);
                                    pSVar13 = local_7f0;
                                    if (uVar4 == 1) {
                                      (anonymous_namespace)::BuildFileImpl::
                                      stringFromScalarNode_abi_cxx11_(&local_820,this,local_7f0);
                                      std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::push_back((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&__range9,&local_820);
                                      std::__cxx11::string::~string((string *)&local_820);
                                    }
                                    else {
                                      strlen("invalid value type for command in \'commands\' map");
                                      error(this,&pSVar13->super_Node,local_800);
                                    }
                                    llvm::yaml::
                                    basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                    ::operator++(&__end9);
                                  }
                                  pCVar14 = std::
                                            unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                            ::operator->(&local_360);
                                  getContext(&local_848,this,(Node *)pSVar8);
                                  local_858 = std::__cxx11::string::data();
                                  local_850 = std::__cxx11::string::length();
                                  local_888._M_current =
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&__range9);
                                  local_890._M_current =
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&__range9);
                                  std::allocator<llvm::StringRef>::allocator(&local_891);
                                  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                                  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>>
                                              *)&local_880,local_888,local_890,&local_891);
                                  llvm::ArrayRef<llvm::StringRef>::
                                  ArrayRef<std::allocator<llvm::StringRef>>(&local_868,&local_880);
                                  iVar5 = (*(pCVar14->super_JobDescriptor)._vptr_JobDescriptor[0xb])
                                                    (pCVar14,&local_848,local_858,local_850,
                                                     local_868.Data,local_868.Length);
                                  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
                                  ~vector(&local_880);
                                  std::allocator<llvm::StringRef>::~allocator(&local_891);
                                  it.Base._4_1_ = (((byte)iVar5 ^ 0xff) & 1) != 0;
                                  if (it.Base._4_1_) {
                                    this_local._7_1_ = 0;
                                  }
                                  it.Base._5_3_ = 0;
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&__range9);
                                  goto joined_r0x001eee45;
                                }
                                uVar4 = llvm::yaml::Node::getType((Node *)this_01);
                                if (uVar4 == 1) {
                                  pCVar14 = std::
                                            unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                            ::operator->(&local_360);
                                  getContext(&local_8d0,this,(Node *)pSVar8);
                                  local_8e0 = std::__cxx11::string::data();
                                  local_8d8 = std::__cxx11::string::length();
                                  (anonymous_namespace)::BuildFileImpl::
                                  stringFromScalarNode_abi_cxx11_
                                            (&local_910,this,(ScalarNode *)this_01);
                                  local_8f0 = std::__cxx11::string::data();
                                  uVar9 = std::__cxx11::string::length();
                                  iVar5 = (*(pCVar14->super_JobDescriptor)._vptr_JobDescriptor[10])
                                                    (pCVar14,&local_8d0,local_8e0,local_8d8,
                                                     local_8f0,uVar9);
                                  std::__cxx11::string::~string((string *)&local_910);
                                  if ((((byte)iVar5 ^ 0xff) & 1) != 0) {
                                    this_local._7_1_ = 0;
                                    it.Base._4_4_ = 1;
                                    goto LAB_001ef078;
                                  }
                                  goto LAB_001ef06e;
                                }
                                strlen("invalid value type for command in \'commands\' map");
                                error(this,(Node *)this_01,local_8a8);
                                it.Base._4_4_ = 10;
                              }
LAB_001ef078:
                              std::__cxx11::string::~string
                                        ((string *)
                                         &values.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              if ((it.Base._4_4_ != 0) && (it.Base._4_4_ != 10)) goto LAB_001ef1fc;
                            }
                            else {
                              strlen("invalid key type in \'commands\' map");
                              error(this,(Node *)pSVar8,stack0xfffffffffffffa38);
                            }
                          }
                        }
                      }
                      llvm::yaml::
                      basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                      operator++(&local_2c8);
                    }
                    pBVar1 = this->delegate;
                    uVar9 = std::__cxx11::string::data();
                    uVar15 = std::__cxx11::string::length();
                    pCVar16 = std::
                              unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                              ::operator*(&local_360);
                    (*pBVar1->_vptr_BuildFileDelegate[0xb])(pBVar1,uVar9,uVar15,pCVar16);
                    uVar9 = std::__cxx11::string::data();
                    local_930.Data = (char *)uVar9;
                    uVar9 = std::__cxx11::string::length();
                    local_930.Length = uVar9;
                    this_03 = llvm::
                              StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                              ::operator[](&this->commands,local_930);
                    std::
                    unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                    ::operator=(this_03,&local_360);
                    it.Base._4_4_ = 0;
                  }
                  else {
                    pKVar6 = llvm::yaml::
                             basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                             ::operator->(&local_2c8);
                    pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar6);
                    strlen("tool failed to create a command");
                    error(this,pNVar7,local_380);
                    this_local._7_1_ = 0;
                    it.Base._4_4_ = 1;
                  }
LAB_001ef1fc:
                  std::
                  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                  ::~unique_ptr(&local_360);
                }
              }
              else {
                pKVar6 = llvm::yaml::
                         basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                         ::operator->(&local_2c8);
                pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar6);
                strlen("invalid \'tool\' value type for command in \'commands\' map");
                error(this,pNVar7,local_318);
                while( true ) {
                  tool = (Tool *)llvm::yaml::MappingNode::end(this_00);
                  bVar3 = llvm::yaml::
                          basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                          ::operator!=(&local_2c8,
                                       (basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                        *)&tool);
                  if (!bVar3) break;
                  llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator++(&local_2c8);
                }
                it.Base._4_4_ = 3;
              }
            }
            else {
              pKVar6 = llvm::yaml::
                       basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                       ::operator->(&local_2c8);
              pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar6);
              strlen("expected \'tool\' initial key for command in \'commands\' map");
              error(this,pNVar7,local_300);
              while( true ) {
                local_308.Base = (MappingNode *)llvm::yaml::MappingNode::end(this_00);
                bVar3 = llvm::yaml::
                        basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                        ::operator!=(&local_2c8,&local_308);
                if (!bVar3) break;
                llvm::yaml::
                basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                operator++(&local_2c8);
              }
              it.Base._4_4_ = 3;
            }
          }
        }
        else {
          pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar6);
          strlen("duplicate command in \'commands\' map");
          error(this,pNVar7,local_2b8);
          it.Base._4_4_ = 3;
        }
        std::__cxx11::string::~string((string *)&attrs);
        if ((it.Base._4_4_ != 0) && (it.Base._4_4_ == 1)) goto LAB_001ef24f;
      }
      else {
        pNVar7 = llvm::yaml::KeyValueNode::getValue(pKVar6);
        strlen("invalid value type in \'commands\' map");
        error(this,pNVar7,stack0xfffffffffffffd90);
      }
    }
    else {
      pNVar7 = llvm::yaml::KeyValueNode::getKey(pKVar6);
      strlen("invalid key type in \'commands\' map");
      error(this,pNVar7,local_260);
    }
    llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
    operator++(&__end2);
  }
  this_local._7_1_ = 1;
LAB_001ef24f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool parseCommandsMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'commands' map");
        continue;
      }
      // Every value must be a mapping.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(entry.getValue(), "invalid value type in 'commands' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::MappingNode* attrs = static_cast<llvm::yaml::MappingNode*>(
          entry.getValue());

      // Check that the command is not a duplicate.
      if (commands.count(name) != 0) {
        error(entry.getKey(), "duplicate command in 'commands' map");
        continue;
      }
      
      // Get the initial attribute, which must be the tool name.
      auto it = attrs->begin();
      if (it == attrs->end()) {
        error(entry.getKey(),
              "missing 'tool' key for command in 'command' map");
        continue;
      }
      if (!nodeIsScalarString(it->getKey(), "tool")) {
        error(it->getKey(),
              "expected 'tool' initial key for command in 'commands' map");
        // Skip to the end.
        while (it != attrs->end()) ++it;
        continue;
      }
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(it->getValue(),
              "invalid 'tool' value type for command in 'commands' map");
        // Skip to the end.
        while (it != attrs->end()) ++it;
        continue;
      }
      
      // Lookup the tool for this command.
      auto tool = getOrCreateTool(
          stringFromScalarNode(
              static_cast<llvm::yaml::ScalarNode*>(
                  it->getValue())),
          it->getValue());
      if (!tool) {
        return false;
      }
        
      // Create the command.
      auto command = tool->createCommand(name);
      if (!command) {
        error(it->getValue(), "tool failed to create a command");
        return false;
      }

      // Parse the remaining command attributes.
      ++it;
      for (; it != attrs->end(); ++it) {
        auto key = it->getKey();
        auto value = it->getValue();
        
        // If this is a known key, parse it.
        if (nodeIsScalarString(key, "inputs")) {
          if (value->getType() != llvm::yaml::Node::NK_Sequence) {
            error(value, "invalid value type for 'inputs' command key");
            continue;
          }

          llvm::yaml::SequenceNode* nodeNames =
            static_cast<llvm::yaml::SequenceNode*>(value);

          std::vector<Node*> nodes;
          for (auto& nodeName: *nodeNames) {
            if (nodeName.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&nodeName, "invalid node type in 'inputs' command key");
              continue;
            }

            nodes.push_back(
                getOrCreateNode(
                    stringFromScalarNode(
                        static_cast<llvm::yaml::ScalarNode*>(&nodeName)),
                    /*isImplicit=*/true));
          }

          command->configureInputs(getContext(key), nodes);
        } else if (nodeIsScalarString(key, "outputs")) {
          if (value->getType() != llvm::yaml::Node::NK_Sequence) {
            error(value, "invalid value type for 'outputs' command key");
            continue;
          }

          llvm::yaml::SequenceNode* nodeNames =
            static_cast<llvm::yaml::SequenceNode*>(value);

          std::vector<Node*> nodes;
          for (auto& nodeName: *nodeNames) {
            if (nodeName.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&nodeName, "invalid node type in 'outputs' command key");
              continue;
            }

            auto node = getOrCreateNode(
                    stringFromScalarNode(
                        static_cast<llvm::yaml::ScalarNode*>(&nodeName)),
                    /*isImplicit=*/true);
            nodes.push_back(node);

            // Add this command to the node producer list.
            node->getProducers().push_back(command.get());
          }

          command->configureOutputs(getContext(key), nodes);
        } else if (nodeIsScalarString(key, "description")) {
          if (value->getType() != llvm::yaml::Node::NK_Scalar) {
            error(value, "invalid value type for 'description' command key");
            continue;
          }

          command->configureDescription(
              getContext(key), stringFromScalarNode(
                  static_cast<llvm::yaml::ScalarNode*>(value)));
        } else {
          // Otherwise, it should be an attribute assignment.
          
          // All keys must be scalar.
          if (key->getType() != llvm::yaml::Node::NK_Scalar) {
            error(key, "invalid key type in 'commands' map");
            continue;
          }

          auto attribute = stringFromScalarNode(
              static_cast<llvm::yaml::ScalarNode*>(key));

          if (value->getType() == llvm::yaml::Node::NK_Mapping) {
            std::vector<std::pair<std::string, std::string>> values;
            for (auto& entry: *static_cast<llvm::yaml::MappingNode*>(value)) {
              // Every key must be scalar.
              if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
                error(entry.getKey(), ("invalid key type for '" + attribute +
                                       "' in 'commands' map"));
                continue;
              }
              // Every value must be scalar.
              if (entry.getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
                error(entry.getKey(), ("invalid value type for '" + attribute +
                                       "' in 'commands' map"));
                continue;
              }

              std::string key = stringFromScalarNode(
                  static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
              std::string value = stringFromScalarNode(
                  static_cast<llvm::yaml::ScalarNode*>(entry.getValue()));
              values.push_back(std::make_pair(key, value));
            }

            if (!command->configureAttribute(
                    getContext(key), attribute,
                    std::vector<std::pair<StringRef, StringRef>>(
                        values.begin(), values.end()))) {
              return false;
            }
          } else if (value->getType() == llvm::yaml::Node::NK_Sequence) {
            std::vector<std::string> values;
            for (auto& node: *static_cast<llvm::yaml::SequenceNode*>(value)) {
              if (node.getType() != llvm::yaml::Node::NK_Scalar) {
                error(&node, "invalid value type for command in 'commands' map");
                continue;
              }
              values.push_back(
                  stringFromScalarNode(
                      static_cast<llvm::yaml::ScalarNode*>(&node)));
            }

            if (!command->configureAttribute(
                    getContext(key), attribute,
                    std::vector<StringRef>(values.begin(), values.end()))) {
              return false;
            }
          } else {
            if (value->getType() != llvm::yaml::Node::NK_Scalar) {
              error(value, "invalid value type for command in 'commands' map");
              continue;
            }
            
            if (!command->configureAttribute(
                    getContext(key), attribute,
                    stringFromScalarNode(
                        static_cast<llvm::yaml::ScalarNode*>(value)))) {
              return false;
            }
          }
        }
      }

      // Let the delegate know we loaded a command.
      delegate.loadedCommand(name, *command);

      // Add the command to the commands map.
      commands[name] = std::move(command);
    }

    return true;
  }